

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

char * al_get_path_extension(ALLEGRO_PATH *path)

{
  ALLEGRO_USTR *us;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  us = path->filename;
  sVar2 = al_ustr_size(us);
  iVar1 = al_ustr_rfind_chr(us,(int)sVar2,0x2e);
  if (iVar1 == -1) {
    sVar2 = al_ustr_size(path->filename);
    iVar1 = (int)sVar2;
  }
  pcVar3 = al_cstr(path->filename);
  return pcVar3 + iVar1;
}

Assistant:

const char *al_get_path_extension(const ALLEGRO_PATH *path)
{
   int pos;
   ASSERT(path);

   pos = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (pos == -1)
      pos = al_ustr_size(path->filename);

   return al_cstr(path->filename) + pos;  /* include dot */
}